

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeStiffnessMatrix(ChElementHexaANCF_3813 *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [64];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  
  lVar27 = 0;
  do {
    puVar1 = (undefined8 *)
             ((long)(this->m_stock_KTE).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    uVar7 = puVar1[4];
    uVar8 = puVar1[5];
    uVar9 = puVar1[6];
    uVar10 = puVar1[7];
    puVar2 = (undefined8 *)
             ((long)(this->m_stock_KTE).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27 + 0x40);
    uVar11 = *puVar2;
    uVar12 = puVar2[1];
    uVar13 = puVar2[2];
    uVar14 = puVar2[3];
    uVar15 = puVar2[4];
    uVar16 = puVar2[5];
    uVar17 = puVar2[6];
    uVar18 = puVar2[7];
    puVar2 = (undefined8 *)
             ((long)(this->m_stock_KTE).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27 + 0x80);
    uVar19 = *puVar2;
    uVar20 = puVar2[1];
    uVar21 = puVar2[2];
    uVar22 = puVar2[3];
    uVar23 = puVar2[4];
    uVar24 = puVar2[5];
    uVar25 = puVar2[6];
    uVar26 = puVar2[7];
    puVar2 = (undefined8 *)
             ((long)(this->m_StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27);
    *puVar2 = *puVar1;
    puVar2[1] = uVar4;
    puVar2[2] = uVar5;
    puVar2[3] = uVar6;
    puVar2[4] = uVar7;
    puVar2[5] = uVar8;
    puVar2[6] = uVar9;
    puVar2[7] = uVar10;
    puVar2 = (undefined8 *)
             ((long)(this->m_StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27 + 0x40);
    *puVar2 = uVar11;
    puVar2[1] = uVar12;
    puVar2[2] = uVar13;
    puVar2[3] = uVar14;
    puVar2[4] = uVar15;
    puVar2[5] = uVar16;
    puVar2[6] = uVar17;
    puVar2[7] = uVar18;
    puVar2 = (undefined8 *)
             ((long)(this->m_StiffnessMatrix).
                    super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                    m_data.array + lVar27 + 0x80);
    *puVar2 = uVar19;
    puVar2[1] = uVar20;
    puVar2[2] = uVar21;
    puVar2[3] = uVar22;
    puVar2[4] = uVar23;
    puVar2[5] = uVar24;
    puVar2[6] = uVar25;
    puVar2[7] = uVar26;
    lVar27 = lVar27 + 0xc0;
  } while (lVar27 != 0x1200);
  lVar27 = 0;
  do {
    auVar29 = *(undefined1 (*) [64])
               ((long)(this->m_StiffnessMatrix).
                      super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                      m_data.array + lVar27 + 0x40);
    auVar3 = *(undefined1 (*) [64])
              ((long)(this->m_StiffnessMatrix).
                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
                     m_data.array + lVar27 + 0x80);
    auVar28 = vsubpd_avx512f(*(undefined1 (*) [64])
                              ((long)(this->m_StiffnessMatrix).
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     .m_storage.m_data.array + lVar27),
                             *(undefined1 (*) [64])
                              ((long)(this->m_stock_jac_EAS).
                                     super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                     .m_storage.m_data.array + lVar27));
    *(undefined1 (*) [64])
     ((long)(this->m_StiffnessMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
     + lVar27) = auVar28;
    auVar29 = vsubpd_avx512f(auVar29,*(undefined1 (*) [64])
                                      ((long)(this->m_stock_jac_EAS).
                                             super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                             .m_storage.m_data.array + lVar27 + 0x40));
    *(undefined1 (*) [64])
     ((long)(this->m_StiffnessMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
     + lVar27 + 0x40) = auVar29;
    auVar29 = vsubpd_avx512f(auVar3,*(undefined1 (*) [64])
                                     ((long)(this->m_stock_jac_EAS).
                                            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                            .m_storage.m_data.array + lVar27 + 0x80));
    *(undefined1 (*) [64])
     ((long)(this->m_StiffnessMatrix).
            super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
     + lVar27 + 0x80) = auVar29;
    lVar27 = lVar27 + 0xc0;
  } while (lVar27 != 0x1200);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeStiffnessMatrix() {
    bool use_numerical_differentiation = false;

    if (use_numerical_differentiation) {
        double diff = 1e-8;
        ChVectorDynamic<> F0(24);
        ChVectorDynamic<> F1(24);
        ComputeInternalForces(F0);
        for (int inode = 0; inode < 8; ++inode) {
            m_nodes[inode]->pos.x() += diff;
            ComputeInternalForces(F1);  // Flag=1 > Jacobian of internal force calculation
            m_StiffnessMatrix.col(0 + inode * 3) = (F0 - F1) * (1.0 / diff);
            m_nodes[inode]->pos.x() -= diff;

            m_nodes[inode]->pos.y() += diff;
            ComputeInternalForces(F1);
            m_StiffnessMatrix.col(1 + inode * 3) = (F0 - F1) * (1.0 / diff);
            m_nodes[inode]->pos.y() -= diff;

            m_nodes[inode]->pos.z() += diff;
            ComputeInternalForces(F1);
            m_StiffnessMatrix.col(2 + inode * 3) = (F0 - F1) * (1.0 / diff);
            m_nodes[inode]->pos.z() -= diff;
        }
        // flag_HE=0 is default
        m_StiffnessMatrix -= m_stock_jac_EAS;  // For Enhanced Assumed Strain
    } else {
        // Put in m_StiffnessMatrix the values for the Jacobian already calculated in the computation of internal forces
        // Note that m_stock_KTE and m_stock_jac_EAS are updated at each iteration of the time step
        m_StiffnessMatrix = m_stock_KTE;
        m_StiffnessMatrix -= m_stock_jac_EAS;
    }
}